

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutBase.cpp
# Opt level: O3

void __thiscall cursespp::LayoutBase::KeyPress(LayoutBase *this)

{
  string *in_RSI;
  
  KeyPress((LayoutBase *)((long)&this[-1].super_Window.title.field_2 + 8),in_RSI);
  return;
}

Assistant:

bool LayoutBase::KeyPress(const std::string& key) {
    auto& keys = NavigationKeys();
    if (keys.Left(key) || keys.Up(key)) {
        this->FocusPrev();
        return true;
    }
    else if (keys.Right(key) || keys.Down(key)) {
        this->FocusNext();
        return true;
    }
    return false;
}